

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void build_impute_node<InputData<float,long>&,WorkerMemory<ImputedData<long,long_double>,long_double,float>&,long_double>
               (ImputeNode *imputer,
               WorkerMemory<ImputedData<long,_long_double>,_long_double,_float> *workspace,
               InputData<float,_long> *input_data,ModelParams *model_params,
               vector<ImputeNode,_std::allocator<ImputeNode>_> *imputer_tree,size_t curr_depth,
               size_t min_imp_obs)

{
  WeighImpRows WVar1;
  size_t sVar2;
  pointer pdVar3;
  pointer pdVar4;
  long *plVar5;
  pointer pIVar6;
  pointer pdVar7;
  double *pdVar8;
  float *pfVar9;
  bool bVar10;
  bool bVar11;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *pvVar12;
  ulong *puVar13;
  uchar *puVar14;
  int *piVar15;
  ulong uVar16;
  ulong uVar17;
  size_t col;
  double *pdVar18;
  ulong *key;
  pointer pvVar19;
  ulong uVar20;
  size_t sVar21;
  ulong uVar22;
  pointer puVar23;
  vector<double,_std::allocator<double>_> *pvVar24;
  size_t sVar25;
  size_t col_2;
  size_t col_1;
  InputData<float,_long> *pIVar26;
  ulong uVar27;
  long *plVar28;
  long lVar29;
  size_t sVar30;
  long lVar31;
  long lVar32;
  longdouble in_ST0;
  longdouble lVar33;
  longdouble lVar34;
  longdouble lVar35;
  int iVar40;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  pointer puVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  int iVar50;
  double dVar48;
  undefined1 auVar49 [16];
  double dVar51;
  undefined1 auVar52 [16];
  double dVar53;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar54;
  vector<double,_std::allocator<double>_> *__range3;
  vector<double,_std::allocator<double>_> *__range3_1;
  double __tmp;
  size_t ix;
  ImputeNode *pIVar55;
  tuple<> local_e9;
  InputData<float,_long> *local_e8;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  pointer local_d0;
  longdouble local_c8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_b8;
  vector<double,_std::allocator<double>_> *local_b0;
  longdouble local_a8;
  undefined1 local_98 [16];
  unsigned_long local_80;
  vector<ImputeNode,_std::allocator<ImputeNode>_> *local_78;
  size_t local_70;
  ModelParams *local_68;
  robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
  *local_60;
  double local_58;
  double local_50;
  double local_48;
  long local_40;
  double local_38;
  
  bVar10 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish ==
           (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar11 = (workspace->weights_map).m_ht.m_nb_elements == 0;
  local_e8 = input_data;
  local_78 = imputer_tree;
  local_70 = curr_depth;
  local_68 = model_params;
  if (bVar10 && bVar11) {
    lVar31 = (workspace->end - workspace->st) + 1;
    auVar37._8_4_ = (int)((ulong)lVar31 >> 0x20);
    auVar37._0_8_ = lVar31;
    auVar37._12_4_ = 0x45300000;
    dVar36 = auVar37._8_8_ - 1.9342813113834067e+25;
    local_98._0_8_ = dVar36 + ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0);
    local_98._8_8_ = dVar36;
  }
  else {
    calculate_sum_weights<long_double>
              ((longdouble *)workspace,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)workspace->st,workspace->end
               ,curr_depth,(size_t)&workspace->weights_arr,
               (vector<double,_std::allocator<double>_> *)&workspace->weights_map,
               (robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                *)imputer);
    local_38 = (double)in_ST0;
    local_98._8_8_ = 0;
    local_98._0_8_ = local_38;
  }
  pIVar26 = local_e8;
  local_e0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (&imputer->num_sum,local_e8->ncols_numeric,(value_type_conflict *)&local_e0);
  local_d8 = &imputer->num_weight;
  local_e0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_d8,pIVar26->ncols_numeric,(value_type_conflict *)&local_e0);
  local_b8 = &imputer->cat_sum;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::resize(local_b8,pIVar26->ncols_categ);
  local_b0 = &imputer->cat_weight;
  local_e0._M_head_impl = (unsigned_long *)0x0;
  std::vector<double,_std::allocator<double>_>::resize
            (local_b0,pIVar26->ncols_categ,(value_type_conflict *)&local_e0);
  if ((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
              (&imputer->num_sum);
  }
  if ((imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_d8)
    ;
  }
  pvVar12 = local_b8;
  if ((imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_sum).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_true>
    ::_S_do_it(local_b8);
  }
  if ((imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage !=
      (imputer->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it(local_b0)
    ;
  }
  uVar16 = local_e8->ncols_categ;
  if (uVar16 != 0) {
    lVar31 = 0;
    uVar27 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&(((pvVar12->
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data + lVar31),(long)local_e8->ncat[uVar27]);
      pvVar19 = (pvVar12->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if (*(long *)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar31 + 0x10) !=
          *(long *)((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar31 + 8)) {
        std::__shrink_to_fit_aux<std::vector<double,_std::allocator<double>_>,_true>::_S_do_it
                  ((vector<double,_std::allocator<double>_> *)
                   ((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data + lVar31));
      }
      uVar27 = uVar27 + 1;
      uVar16 = local_e8->ncols_categ;
      lVar31 = lVar31 + 0x18;
    } while (uVar27 < uVar16);
  }
  sVar2 = local_e8->ncols_numeric;
  pIVar26 = local_e8;
  if ((uVar16 != 0) || (local_e8->Xc_indptr == (long *)0x0 && sVar2 != 0)) {
    pfVar9 = local_e8->numeric_data;
    if (bVar10 && bVar11) {
      if (sVar2 != 0 && pfVar9 != (float *)0x0) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar27 = workspace->st;
        uVar20 = workspace->end;
        sVar21 = local_e8->nrows;
        local_a8 = (longdouble)CONCAT28(local_a8._8_2_,sVar21);
        pdVar3 = (local_d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        sVar25 = 0;
        dVar36 = (double)DAT_0036b1d0;
        dVar51 = DAT_0036b1d0._8_8_;
        local_c8 = (longdouble)CONCAT28(local_c8._8_2_,sVar2);
        do {
          dVar48 = 0.0;
          if (uVar27 <= uVar20) {
            pdVar4 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar31 = 0;
            uVar22 = uVar27;
            do {
              dVar48 = (double)pfVar9[sVar21 * sVar25 + puVar23[uVar22]];
              if (ABS(dVar48) != INFINITY && !NAN(pfVar9[sVar21 * sVar25 + puVar23[uVar22]])) {
                lVar31 = lVar31 + 1;
                local_48 = pdVar4[sVar25];
                local_50 = dVar48 - local_48;
                pdVar4[sVar25] =
                     (double)((float)local_50 / ((float)lVar31 + (float)(&DAT_0036b0d8)[lVar31 < 0])
                             + (float)local_48);
                local_40 = lVar31;
              }
              uVar22 = uVar22 + 1;
            } while (uVar22 <= uVar20);
            auVar45._8_4_ = (int)((ulong)lVar31 >> 0x20);
            auVar45._0_8_ = lVar31;
            auVar45._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar48 = (auVar45._8_8_ - dVar51) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar31) - dVar36);
          }
          pdVar3[sVar25] = dVar48;
          sVar25 = sVar25 + 1;
        } while (sVar25 != sVar2);
      }
      piVar15 = local_e8->categ_data;
      if (uVar16 != 0 && piVar15 != (int *)0x0) {
        puVar23 = (workspace->ix_arr).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        uVar27 = workspace->st;
        uVar20 = workspace->end;
        sVar2 = local_e8->nrows;
        pdVar3 = (local_b0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar22 = 0;
        dVar36 = (double)DAT_0036b1d0;
        dVar51 = DAT_0036b1d0._8_8_;
        do {
          dVar48 = 0.0;
          if (uVar27 <= uVar20) {
            pvVar19 = (local_b8->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            lVar31 = 0;
            uVar17 = uVar27;
            do {
              lVar32 = (long)piVar15[sVar2 * uVar22 + puVar23[uVar17]];
              if (-1 < lVar32) {
                lVar31 = lVar31 + 1;
                lVar29 = *(long *)&pvVar19[uVar22].
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data;
                *(double *)(lVar29 + lVar32 * 8) = *(double *)(lVar29 + lVar32 * 8) + 1.0;
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 <= uVar20);
            auVar47._8_4_ = (int)((ulong)lVar31 >> 0x20);
            auVar47._0_8_ = lVar31;
            auVar47._12_4_ = SUB164(ZEXT816(0x4530000043300000),4);
            dVar48 = (auVar47._8_8_ - dVar51) +
                     ((double)CONCAT44(SUB164(ZEXT816(0x4530000043300000),0),(int)lVar31) - dVar36);
          }
          pdVar3[uVar22] = dVar48;
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar16);
      }
    }
    else {
      pIVar55 = imputer;
      if ((pfVar9 != (float *)0x0) && (local_e8->ncols_numeric != 0)) {
        uVar16 = 0;
        pvVar24 = local_d8;
        do {
          uVar27 = workspace->st;
          lVar34 = (longdouble)0;
          if (uVar27 <= workspace->end) {
            lVar31 = uVar27 * 8;
            lVar35 = (longdouble)0;
            lVar34 = lVar35;
            do {
              puVar23 = (workspace->ix_arr).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              lVar32 = *(long *)((long)puVar23 + lVar31);
              puVar44 = (pointer)(double)pIVar26->numeric_data[lVar32 + pIVar26->nrows * uVar16];
              if (ABS((double)puVar44) != INFINITY &&
                  !NAN(pIVar26->numeric_data[lVar32 + pIVar26->nrows * uVar16])) {
                pdVar3 = (workspace->weights_arr).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                  local_e0._M_head_impl = (unsigned_long *)((long)puVar23 + lVar31);
                  imputer = pIVar55;
                  local_d0 = puVar44;
                  local_c8 = lVar34;
                  local_a8 = lVar35;
                  pVar54 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                       *)&workspace->weights_map,local_e0._M_head_impl,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_e0,(tuple<> *)&local_80
                                     );
                  puVar14 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
                  pvVar24 = local_d8;
                  pIVar26 = local_e8;
                  lVar33 = local_c8;
                  lVar35 = local_a8;
                  pIVar55 = imputer;
                  puVar44 = local_d0;
                }
                else {
                  puVar14 = (uchar *)(pdVar3 + lVar32);
                  lVar33 = lVar34;
                }
                local_58 = *(double *)puVar14;
                pdVar3 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar3[uVar16] = pdVar3[uVar16] + local_58;
                local_58 = (double)puVar44 * local_58;
                lVar34 = lVar33 + ((longdouble)local_58 - lVar35);
                lVar35 = (lVar34 - lVar33) - ((longdouble)local_58 - lVar35);
              }
              uVar27 = uVar27 + 1;
              lVar31 = lVar31 + 8;
            } while (uVar27 <= workspace->end);
          }
          (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar16] =
               (double)(lVar34 / (longdouble)
                                 (imputer->num_weight).
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[uVar16]);
          uVar16 = uVar16 + 1;
        } while (uVar16 < pIVar26->ncols_numeric);
      }
      imputer = pIVar55;
      if ((pIVar26->ncols_categ != 0) && (uVar16 = workspace->st, uVar16 <= workspace->end)) {
        do {
          local_80 = (workspace->ix_arr).
                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar16];
          pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish == pdVar3) {
            local_e0._M_head_impl = &local_80;
            pVar54 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)&workspace->weights_map,&local_80,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_e0,&local_e9);
            puVar14 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
            pIVar26 = local_e8;
          }
          else {
            puVar14 = (uchar *)(pdVar3 + local_80);
          }
          sVar2 = pIVar26->ncols_categ;
          if (sVar2 != 0) {
            dVar36 = *(double *)puVar14;
            sVar21 = pIVar26->nrows;
            piVar15 = pIVar26->categ_data + local_80;
            pvVar19 = (local_b8->
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pdVar3 = (local_b0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            sVar25 = 0;
            do {
              lVar31 = (long)*piVar15;
              if (-1 < lVar31) {
                lVar32 = *(long *)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>).
                                   _M_impl.super__Vector_impl_data;
                *(double *)(lVar32 + lVar31 * 8) = *(double *)(lVar32 + lVar31 * 8) + dVar36;
                pdVar3[sVar25] = pdVar3[sVar25] + dVar36;
              }
              sVar25 = sVar25 + 1;
              piVar15 = piVar15 + sVar21;
              pvVar19 = pvVar19 + 1;
            } while (sVar2 != sVar25);
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 <= workspace->end);
      }
    }
  }
  auVar45 = _DAT_0036b1f0;
  auVar37 = _DAT_0036b1e0;
  pIVar55 = imputer;
  if (pIVar26->Xc_indptr != (long *)0x0) {
    puVar23 = (workspace->ix_arr).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
              _M_impl.super__Vector_impl_data._M_start;
    pdVar3 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar3 != pdVar4) {
      uVar16 = (long)pdVar4 + (-8 - (long)pdVar3);
      auVar38._8_4_ = (int)uVar16;
      auVar38._0_8_ = uVar16;
      auVar38._12_4_ = (int)(uVar16 >> 0x20);
      auVar39._0_8_ = uVar16 >> 3;
      auVar39._8_8_ = auVar38._8_8_ >> 3;
      uVar27 = 0;
      auVar39 = auVar39 ^ _DAT_0036b1f0;
      do {
        auVar46._8_4_ = (int)uVar27;
        auVar46._0_8_ = uVar27;
        auVar46._12_4_ = (int)(uVar27 >> 0x20);
        auVar47 = (auVar46 | auVar37) ^ auVar45;
        bVar10 = auVar39._0_4_ < auVar47._0_4_;
        iVar40 = auVar39._4_4_;
        iVar50 = auVar47._4_4_;
        if ((bool)(~(iVar40 < iVar50 || iVar50 == iVar40 && bVar10) & 1)) {
          pdVar3[uVar27] = (double)local_98._0_8_;
        }
        if (iVar40 >= iVar50 && (iVar50 != iVar40 || !bVar10)) {
          pdVar3[uVar27 + 1] = (double)local_98._0_8_;
        }
        uVar27 = uVar27 + 2;
      } while (((uVar16 >> 3) + 2 & 0xfffffffffffffffe) != uVar27);
    }
    if (pIVar26->ncols_numeric != 0) {
      local_c8 = (longdouble)CONCAT28(local_c8._8_2_,puVar23 + 1);
      local_60 = (robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                  *)&workspace->weights_map;
      uVar16 = 0;
      pvVar24 = local_d8;
      local_d0 = puVar23;
      do {
        lVar31 = pIVar26->Xc_indptr[uVar16];
        key = puVar23 + workspace->st;
        uVar27 = (long)((local_c8._0_8_ + workspace->end * 8) - (long)key) >> 3;
        if (0 < (long)uVar27) {
          do {
            uVar20 = uVar27 >> 1;
            uVar22 = ~uVar20 + uVar27;
            uVar27 = uVar20;
            if ((key + uVar20 + 1)[-1] < (ulong)pIVar26->Xc_ind[lVar31]) {
              key = key + uVar20 + 1;
              uVar27 = uVar22;
            }
          } while (0 < (long)uVar27);
        }
        puVar13 = (ulong *)(local_c8._0_8_ + workspace->end * 8);
        puVar23 = local_d0;
        if ((key != puVar13) && (lVar32 = pIVar26->Xc_indptr[uVar16 + 1], lVar31 != lVar32)) {
          lVar29 = lVar32 + -1;
          local_a8 = (longdouble)CONCAT28(local_a8._8_2_,pIVar26->Xc_ind[lVar32 + -1]);
          while( true ) {
            uVar27 = *key;
            if (local_a8._0_8_ < uVar27) break;
            plVar28 = pIVar26->Xc_ind;
            uVar20 = plVar28[lVar31];
            if (uVar20 == uVar27) {
              fVar43 = pIVar26->Xc[lVar31];
              pdVar3 = (workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              if ((workspace->weights_arr).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_finish == pdVar3) {
                dVar36 = 1.0;
                if ((workspace->weights_map).m_ht.m_nb_elements != 0) {
                  local_b8 = (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              *)CONCAT44(local_b8._4_4_,fVar43);
                  imputer = pIVar55;
                  local_e0._M_head_impl = key;
                  pVar54 = tsl::detail_robin_hash::
                           robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           ::
                           insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                                     (local_60,key,
                                      (piecewise_construct_t *)&std::piecewise_construct,
                                      (tuple<const_unsigned_long_&> *)&local_e0,&local_e9);
                  puVar14 = (pVar54.first.m_bucket.m_bucket)->m_value + 8;
                  puVar23 = local_d0;
                  pvVar24 = local_d8;
                  pIVar26 = local_e8;
                  pIVar55 = imputer;
                  fVar43 = local_b8._0_4_;
                  goto LAB_002c75bf;
                }
              }
              else {
                puVar14 = (uchar *)(pdVar3 + uVar27);
LAB_002c75bf:
                dVar36 = *(double *)puVar14;
              }
              if (ABS((double)fVar43) == INFINITY || NAN(fVar43)) {
                pdVar3 = (pvVar24->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                pdVar3[uVar16] = pdVar3[uVar16] - dVar36;
              }
              else {
                pdVar3 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
                pdVar3[uVar16] = dVar36 * (double)fVar43 + pdVar3[uVar16];
              }
              if ((key == puVar23 + workspace->end) || (lVar31 == lVar29)) break;
              plVar5 = pIVar26->Xc_ind;
              plVar28 = plVar5 + lVar31;
              key = key + 1;
              uVar27 = (long)plVar5 + (lVar29 * 8 - (long)plVar28) + 8 >> 3;
              if (0 < (long)uVar27) {
                do {
                  uVar20 = uVar27 >> 1;
                  uVar22 = ~uVar20 + uVar27;
                  uVar27 = uVar20;
                  if ((ulong)(plVar28 + uVar20 + 1)[-1] < *key) {
                    plVar28 = plVar28 + uVar20 + 1;
                    uVar27 = uVar22;
                  }
                } while (0 < (long)uVar27);
              }
              lVar31 = (long)plVar28 - (long)plVar5;
LAB_002c767d:
              lVar31 = lVar31 >> 3;
            }
            else {
              if ((long)uVar20 <= (long)uVar27) {
                plVar5 = plVar28 + lVar31 + 1;
                uVar20 = (long)plVar28 + (lVar29 * 8 - (long)(plVar28 + lVar31 + 1)) + 8 >> 3;
                while (0 < (long)uVar20) {
                  uVar22 = uVar20 >> 1;
                  uVar17 = ~uVar22 + uVar20;
                  uVar20 = uVar22;
                  if ((ulong)(plVar5 + uVar22 + 1)[-1] < uVar27) {
                    plVar5 = plVar5 + uVar22 + 1;
                    uVar20 = uVar17;
                  }
                }
                lVar31 = (long)plVar5 - (long)plVar28;
                goto LAB_002c767d;
              }
              key = key + 1;
              uVar27 = (long)puVar13 - (long)key >> 3;
              while (0 < (long)uVar27) {
                uVar22 = uVar27 >> 1;
                uVar17 = ~uVar22 + uVar27;
                uVar27 = uVar22;
                if ((key + uVar22 + 1)[-1] < uVar20) {
                  key = key + uVar22 + 1;
                  uVar27 = uVar17;
                }
              }
            }
            puVar13 = (ulong *)(local_c8._0_8_ + workspace->end * 8);
            if ((key == puVar13) || (lVar31 == lVar32)) break;
          }
        }
        pdVar3 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar3[uVar16] =
             pdVar3[uVar16] /
             (imputer->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar16];
        uVar16 = uVar16 + 1;
      } while (uVar16 < pIVar26->ncols_numeric);
    }
  }
  auVar41._0_8_ = (double)CONCAT44(0x43300000,(int)min_imp_obs);
  auVar41._8_4_ = (int)(min_imp_obs >> 0x20);
  auVar41._12_4_ = 0x45300000;
  dVar36 = (auVar41._8_8_ - 1.9342813113834067e+25) + (auVar41._0_8_ - 4503599627370496.0);
  pdVar3 = (imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((imputer->num_sum).super__Vector_base<double,_std::allocator<double>_>._M_impl.
       super__Vector_impl_data._M_finish != pdVar3) && (sVar2 = local_e8->ncols_numeric, sVar2 != 0)
     ) {
    pdVar4 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = pIVar55->parent;
    pIVar6 = (local_78->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar25 = 0;
    do {
      pdVar18 = pdVar4 + sVar25;
      if (*pdVar18 <= dVar36 && dVar36 != *pdVar18) {
        dVar51 = *(double *)
                  (*(long *)&pIVar6[sVar21].num_sum.
                             super__Vector_base<double,_std::allocator<double>_>._M_impl +
                  sVar25 * 8);
        dVar48 = 2.0;
        sVar30 = sVar21;
        if (0x7fefffffffffffff < (ulong)ABS(dVar51)) {
          lVar31 = 2;
          do {
            if (sVar30 == 0) {
              pdVar3[sVar25] = NAN;
              dVar48 = 0.0;
              goto LAB_002c7806;
            }
            sVar30 = pIVar6[sVar30].parent;
            dVar51 = *(double *)
                      (*(long *)&pIVar6[sVar30].num_sum.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl +
                      sVar25 * 8);
            lVar31 = lVar31 + 2;
          } while (0x7fefffffffffffff < (ulong)ABS(dVar51));
          auVar52._8_4_ = (int)((ulong)lVar31 >> 0x20);
          auVar52._0_8_ = lVar31;
          auVar52._12_4_ = 0x45300000;
          dVar48 = (auVar52._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0);
        }
        pdVar3[sVar25] =
             dVar51 / *(double *)
                       (*(long *)&pIVar6[sVar30].num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl +
                       sVar25 * 8);
        dVar48 = (double)local_98._0_8_ / dVar48;
LAB_002c7806:
        pdVar4[sVar25] = dVar48;
      }
      sVar25 = sVar25 + 1;
    } while (sVar25 != sVar2);
  }
  pvVar19 = (pIVar55->cat_sum).
            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (((pIVar55->cat_sum).
       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish != pvVar19) &&
     (sVar2 = local_e8->ncols_categ, sVar2 != 0)) {
    pdVar4 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar21 = pIVar55->parent;
    pIVar6 = (local_78->super__Vector_base<ImputeNode,_std::allocator<ImputeNode>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar15 = local_e8->ncat;
    sVar25 = 0;
    do {
      if (dVar36 <= pdVar4[sVar25]) {
        pdVar8 = pvVar19[sVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pdVar18 = pvVar19[sVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
          *pdVar18 = *pdVar18 / pdVar4[sVar25];
        }
      }
      else {
        lVar31 = *(long *)&pIVar6[sVar21].cat_weight.
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data;
        dVar51 = 2.0;
        sVar30 = sVar21;
        if (*(double *)(lVar31 + sVar25 * 8) <= 0.0) {
          lVar32 = 2;
          do {
            if (sVar30 == 0) goto LAB_002c7960;
            sVar30 = pIVar6[sVar30].parent;
            lVar31 = *(long *)&pIVar6[sVar30].cat_weight.
                               super__Vector_base<double,_std::allocator<double>_>._M_impl;
            lVar32 = lVar32 + 2;
          } while (*(double *)(lVar31 + sVar25 * 8) <= 0.0);
          auVar49._8_4_ = (int)((ulong)lVar32 >> 0x20);
          auVar49._0_8_ = lVar32;
          auVar49._12_4_ = 0x45300000;
          dVar51 = (auVar49._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)lVar32) - 4503599627370496.0);
        }
        iVar40 = piVar15[sVar25];
        if (0 < (long)iVar40) {
          lVar32 = *(long *)(*(long *)&pIVar6[sVar30].cat_sum.
                                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                       ._M_impl + sVar25 * 0x18);
          pdVar7 = pvVar19[sVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar29 = 0;
          do {
            dVar48 = *(double *)(lVar32 + lVar29 * 8);
            dVar53 = 0.0;
            if (0.0 < dVar48) {
              dVar53 = dVar48 / *(double *)(lVar31 + sVar25 * 8);
            }
            pdVar7[lVar29] = dVar53 + pdVar7[lVar29];
            pdVar4[sVar25] = (double)local_98._0_8_ / dVar51;
            lVar29 = lVar29 + 1;
          } while (iVar40 != lVar29);
        }
LAB_002c7960:
        dVar51 = 0.0;
        for (pdVar18 = pvVar19[sVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
            pdVar18 !=
            pvVar19[sVar25].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish; pdVar18 = pdVar18 + 1) {
          dVar51 = dVar51 + *pdVar18;
        }
        pdVar4[sVar25] = dVar51;
      }
      sVar25 = sVar25 + 1;
    } while (sVar25 != sVar2);
  }
  WVar1 = local_68->weigh_imp_rows;
  if (WVar1 == Flat) {
    pdVar8 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (double)local_98._0_8_;
    }
    pdVar8 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (double)local_98._0_8_;
    }
  }
  else if (WVar1 == Inverse) {
    pdVar8 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (SQRT((double)local_98._0_8_) * (double)local_98._0_8_);
    }
    pdVar8 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / (SQRT((double)local_98._0_8_) * (double)local_98._0_8_);
    }
  }
  lVar31 = local_70 + 1;
  auVar42._8_4_ = (int)((ulong)lVar31 >> 0x20);
  auVar42._0_8_ = lVar31;
  auVar42._12_4_ = 0x45300000;
  dVar36 = (auVar42._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)lVar31) - 4503599627370496.0);
  if (local_68->depth_imp == Higher) {
    pdVar8 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 * dVar36;
    }
    pdVar8 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 * dVar36;
    }
  }
  else if (local_68->depth_imp == Lower) {
    pdVar8 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->num_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / dVar36;
    }
    pdVar8 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar18 = (pIVar55->cat_weight).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start; pdVar18 != pdVar8; pdVar18 = pdVar18 + 1) {
      *pdVar18 = *pdVar18 / dVar36;
    }
  }
  if ((WVar1 != Prop) || (local_68->depth_imp != Same)) {
    sVar2 = local_e8->ncols_numeric;
    if (sVar2 != 0) {
      pdVar4 = (local_d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = 0;
      do {
        pdVar3[sVar21] = pdVar4[sVar21] * pdVar3[sVar21];
        sVar21 = sVar21 + 1;
      } while (sVar2 != sVar21);
    }
    sVar2 = local_e8->ncols_categ;
    if (sVar2 != 0) {
      piVar15 = local_e8->ncat;
      pdVar3 = (local_b0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      sVar21 = 0;
      do {
        iVar40 = piVar15[sVar21];
        if (0 < (long)iVar40) {
          pdVar4 = pvVar19[sVar21].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          lVar31 = 0;
          do {
            pdVar4[lVar31] = pdVar3[sVar21] * pdVar4[lVar31];
            lVar31 = lVar31 + 1;
          } while (iVar40 != lVar31);
        }
        sVar21 = sVar21 + 1;
      } while (sVar21 != sVar2);
    }
  }
  return;
}

Assistant:

void build_impute_node(ImputeNode &imputer,    WorkerMemory &workspace,
                       InputData  &input_data, ModelParams  &model_params,
                       std::vector<ImputeNode> &imputer_tree,
                       size_t curr_depth, size_t min_imp_obs)
{
    double wsum;
    bool has_weights = workspace.weights_arr.size() || workspace.weights_map.size();
    if (!has_weights)
        wsum = (double)(workspace.end - workspace.st + 1);
    else
        wsum = calculate_sum_weights<ldouble_safe>(
                                     workspace.ix_arr, workspace.st, workspace.end, curr_depth,
                                     workspace.weights_arr, workspace.weights_map);

    imputer.num_sum.resize(input_data.ncols_numeric, 0);
    imputer.num_weight.resize(input_data.ncols_numeric, 0);
    imputer.cat_sum.resize(input_data.ncols_categ);
    imputer.cat_weight.resize(input_data.ncols_categ, 0);
    imputer.num_sum.shrink_to_fit();
    imputer.num_weight.shrink_to_fit();
    imputer.cat_sum.shrink_to_fit();
    imputer.cat_weight.shrink_to_fit();

    /* Note: in theory, 'num_weight' could be initialized to 'wsum',
       and the entries could get subtracted the weight afterwards, but due to rounding
       error, this could produce some cases of no-present observations having positive
       weight, or cases of negative weight, so it's better to add it for each row after
       checking for possible NAs, even though it's less computationally efficient.
       For sparse matrices it's done the other way as otherwise it would be too slow. */

    for (size_t col = 0; col < input_data.ncols_categ; col++)
    {
        imputer.cat_sum[col].resize(input_data.ncat[col]);
        imputer.cat_sum[col].shrink_to_fit();
    }

    double  xnum;
    int     xcat;
    double  weight;
    size_t  ix;

    if ((input_data.Xc_indptr == NULL && input_data.ncols_numeric) || input_data.ncols_categ)
    {
        if (!has_weights)
        {
            size_t cnt;
            if (input_data.numeric_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            cnt++;
                            imputer.num_sum[col] += (xnum - imputer.num_sum[col]) / (ldouble_safe)cnt;
                        }
                    }
                    imputer.num_weight[col] = (double) cnt;
                }
            }

            if (input_data.categ_data != NULL)
            {
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    cnt = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xcat = input_data.categ_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            cnt++;
                            imputer.cat_sum[col][xcat]++; /* later gets divided */
                        }
                    }
                    imputer.cat_weight[col] = (double) cnt;
                }
            }

        }

        else
        {
            ldouble_safe prod_sum, corr, val, diff;
            if (input_data.numeric_data != NULL)
            {
                 for (size_t col = 0; col < input_data.ncols_numeric; col++)
                 {
                    prod_sum = 0; corr = 0;
                    for (size_t row = workspace.st; row <= workspace.end; row++)
                    {
                        xnum = input_data.numeric_data[workspace.ix_arr[row] + col * input_data.nrows];
                        if (!is_na_or_inf(xnum))
                        {
                            if (workspace.weights_arr.size())
                                weight = workspace.weights_arr[workspace.ix_arr[row]];
                            else
                                weight = workspace.weights_map[workspace.ix_arr[row]];

                            imputer.num_weight[col] += weight; /* these are always <= 1 */
                            val      =  (xnum * weight) - corr;
                            diff     =  prod_sum + val;
                            corr     =  (diff - prod_sum) - val;
                            prod_sum =  diff;
                        }
                    }
                    imputer.num_sum[col] = prod_sum / imputer.num_weight[col];
                 }
            }


            if (input_data.ncols_categ)
            {
                for (size_t row = workspace.st; row <= workspace.end; row++)
                {
                    ix = workspace.ix_arr[row];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[ix];
                    else
                        weight = workspace.weights_map[ix];

                    for (size_t col = 0; col < input_data.ncols_categ; col++)
                    {
                        xcat = input_data.categ_data[ix + col * input_data.nrows];
                        if (xcat >= 0)
                        {
                            imputer.cat_sum[col][xcat] += weight; /* later gets divided */
                            imputer.cat_weight[col]    += weight;
                        }
                    }
                }
            }
        }
    }

    if (input_data.Xc_indptr != NULL) /* sparse numeric */
    {
        size_t *ix_arr = workspace.ix_arr.data();
        size_t st_col, end_col, ind_end_col, curr_pos;
        std::fill(imputer.num_weight.begin(), imputer.num_weight.end(), wsum);

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            st_col      =  input_data.Xc_indptr[col];
            end_col     =  input_data.Xc_indptr[col + 1] - 1;
            ind_end_col =  input_data.Xc_ind[end_col];
            curr_pos    =  st_col;
            for (size_t *row = std::lower_bound(ix_arr + workspace.st, ix_arr + workspace.end + 1, input_data.Xc_ind[st_col]);
                 row != ix_arr + workspace.end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
                )
            {
                if (input_data.Xc_ind[curr_pos] == static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                {
                    xnum = input_data.Xc[curr_pos];
                    if (workspace.weights_arr.size())
                        weight = workspace.weights_arr[*row];
                    else if (workspace.weights_map.size())
                        weight = workspace.weights_map[*row];
                    else
                        weight = 1;

                    if (!is_na_or_inf(xnum))
                    {
                        imputer.num_sum[col]    += weight * xnum;
                    }

                    else
                    {
                        imputer.num_weight[col] -= weight;
                    }

                    if (row == ix_arr + workspace.end || curr_pos == end_col) break;
                    curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos, input_data.Xc_ind + end_col + 1, *(++row)) - input_data.Xc_ind;
                }

                else
                {
                    if (input_data.Xc_ind[curr_pos] > static_cast<typename std::remove_pointer<decltype(input_data.Xc_ind)>::type>(*row))
                        row = std::lower_bound(row + 1, ix_arr + workspace.end + 1, input_data.Xc_ind[curr_pos]);
                    else
                        curr_pos = std::lower_bound(input_data.Xc_ind + curr_pos + 1, input_data.Xc_ind + end_col + 1, *row) - input_data.Xc_ind;
                }
            }

            imputer.num_sum[col] /= imputer.num_weight[col];
        }
    }

    /* if any value is not possible to impute, look it up from the parent tree, but assign a lesser weight
       Note: in theory, the parent node should always have some imputation value for every variable, but due to
       numeric rounding errors, it might have a weight of zero, so in those cases it's looked up higher up the
       tree instead. */
    size_t look_aboves, curr_tree;
    double min_imp_obs_dbl = (double) min_imp_obs;
    if (imputer.num_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            if (imputer.num_weight[col] < min_imp_obs_dbl)
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (!is_na_or_inf(imputer_tree[curr_tree].num_sum[col]))
                    {
                        imputer.num_sum[col]     =  imputer_tree[curr_tree].num_sum[col] / imputer_tree[curr_tree].num_weight[col];
                        imputer.num_weight[col]  =  wsum / (double)(2 * look_aboves);
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        imputer.num_sum[col]    = NAN;
                        imputer.num_weight[col] = 0;
                        break;
                    }
                }
            }
        }
    }

    if (imputer.cat_sum.size())
    {
        for (size_t col = 0; col < input_data.ncols_categ; col++)
        {
            if (imputer.cat_weight[col] >= min_imp_obs_dbl)
            {
                for (double &cat : imputer.cat_sum[col])
                    cat /= imputer.cat_weight[col];
            }

            else
            {
                look_aboves = 1;
                curr_tree   = imputer.parent;
                while (true)
                {
                    if (imputer_tree[curr_tree].cat_weight[col] > 0)
                    {
                        for (int cat = 0; cat < input_data.ncat[col]; cat++)
                        {
                            imputer.cat_sum[col][cat]
                                +=
                            (imputer_tree[curr_tree].cat_sum[col][cat] > 0)?
                                (imputer_tree[curr_tree].cat_sum[col][cat] / imputer_tree[curr_tree].cat_weight[col]) : 0.;
                            imputer.cat_weight[col]    =  wsum / (double)(2 * look_aboves);
                        }
                        break;
                    }

                    else if (curr_tree > 0)
                    {
                        curr_tree = imputer_tree[curr_tree].parent;
                        look_aboves++;
                    }

                    else /* will only happen if every single value is missing */
                    {
                        break;
                    }
                }
                imputer.cat_weight[col] = std::accumulate(imputer.cat_sum[col].begin(),
                                                          imputer.cat_sum[col].end(),
                                                          (double) 0);
            }
        }
    }

    /* re-adjust the weights according to parameters
       (note that by this point, the weights are a sum) */
    switch(model_params.weigh_imp_rows)
    {
        case Inverse:
        {
            double wsum_div = wsum * std::sqrt(wsum);
            for (double &w : imputer.num_weight)
                w /= wsum_div;

            for (double &w : imputer.cat_weight)
                w /= wsum_div;
            break;
        }

        case Flat:
        {
            for (double &w : imputer.num_weight)
                w /= wsum;
            for (double &w : imputer.cat_weight)
                w /= wsum;
            break;
        }

        default: {}

        /* TODO: maybe divide by nrows for prop */
    }

    double curr_depth_dbl = (double) (curr_depth + 1);
    switch(model_params.depth_imp)
    {
        case Lower:
        {
            for (double &w : imputer.num_weight)
                w /= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w /= curr_depth_dbl;
            break;
        }

        case Higher:
        {
            for (double &w : imputer.num_weight)
                w *= curr_depth_dbl;
            for (double &w : imputer.cat_weight)
                w *= curr_depth_dbl;
            break;
        }

        default: {}
    }

    /* now re-adjust sums */
    if (model_params.weigh_imp_rows != Prop || model_params.depth_imp != Same)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            imputer.num_sum[col] *= imputer.num_weight[col];

        for (size_t col = 0; col < input_data.ncols_categ; col++)
            for (int cat = 0; cat < input_data.ncat[col]; cat++)
                imputer.cat_sum[col][cat] *= imputer.cat_weight[col];
    }
}